

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Windows::BeyondCompare4Reporter::BeyondCompare4Reporter(BeyondCompare4Reporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Windows::BEYOND_COMPARE_4();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0015e348;
  return;
}

Assistant:

BeyondCompare4Reporter::BeyondCompare4Reporter()
            : GenericDiffReporter(DiffPrograms::Windows::BEYOND_COMPARE_4())
        {
        }